

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O1

void sha1ni(void *key,int len,uint32_t seed,void *out)

{
  uint8_t *data;
  uint uVar1;
  uint length;
  uint32_t state [5];
  uint8_t padded [64];
  ulong local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  uint8_t local_78 [72];
  
  uStack_90 = 0x1032547698badcfe;
  local_88 = 0xc3d2e1f0;
  local_98 = CONCAT44(0xefcdab89,seed) ^ 0x67452301;
  if (len < 0x40) {
    memcpy(local_78,key,(long)len);
    memset(local_78 + len,0,(ulong)(0x40 - len));
    len = 0x40;
    key = local_78;
  }
  else if ((len & 0x3fU) != 0) {
    uVar1 = 0x40 - (len & 0x3fU);
    length = uVar1 + len;
    data = (uint8_t *)malloc((ulong)length);
    memcpy(data,key,(ulong)(uint)len);
    memset(data + (uint)len,0,(ulong)uVar1);
    sha1_process_x86((uint32_t *)&local_98,data,length);
    free(data);
    goto LAB_0010b076;
  }
  sha1_process_x86((uint32_t *)&local_98,(uint8_t *)key,len);
LAB_0010b076:
  *(undefined4 *)((long)out + 0x10) = local_88;
  *(ulong *)out = local_98;
  *(undefined8 *)((long)out + 8) = uStack_90;
  return;
}

Assistant:

inline void sha1ni(const void *key, int len, uint32_t seed, void *out)
{
  // objsize: 0x2c1 + this (0x408bac - 0x408a90) = 989
  uint32_t state[5] = {0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0};
  state[0] = 0x67452301U ^ seed;
  if (len < 64) {
    uint8_t padded[64];
    memcpy (padded, key, len);
    memset (&padded[len], 0, 64-len);
    sha1_process_x86(state, (const uint8_t*)padded, 64);
  } else if (len % 64) {
    uint32_t lenpadded = len + (64 - len % 64);
    uint8_t *padded = (uint8_t*)malloc (lenpadded);
    memcpy (padded, key, len);
    memset (&padded[len], 0, lenpadded-len);
    sha1_process_x86(state, (const uint8_t*)padded, lenpadded);
    free (padded);
  } else {
    sha1_process_x86(state, (const uint8_t*)key, (uint32_t)len);
  }
  memcpy(out, state, 20);
}